

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O1

void __thiscall QXcbWindow::hide(QXcbWindow *this)

{
  QPlatformWindow *pQVar1;
  xcb_connection_t *pxVar2;
  QXcbConnection *this_00;
  QXcbWindow *pQVar3;
  undefined1 *puVar4;
  char cVar5;
  byte bVar6;
  long lVar7;
  QPlatformWindow *pQVar8;
  long *plVar9;
  QPoint *pQVar10;
  QScreen *pQVar11;
  undefined8 uVar12;
  long lVar13;
  long in_FS_OFFSET;
  bool bVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  QPointF QVar18;
  QPoint devicePosition;
  QPoint cursorPos;
  QPoint nativePos;
  QPoint *local_e0;
  QPointF local_d0;
  QPointF local_c0;
  QArrayData *local_b0;
  undefined1 *puStack_a8;
  undefined1 *local_a0;
  QPoint local_90;
  QPoint local_88;
  undefined8 local_80;
  uint5 uStack_78;
  undefined3 uStack_73;
  undefined1 *local_70;
  undefined1 *puStack_68;
  long local_60;
  
  local_60 = *(long *)(in_FS_OFFSET + 0x28);
  xcb_unmap_window((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).
                   m_xcbConnection);
  _uStack_78 = 0;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = 0x12;
  pQVar1 = &this->super_QPlatformWindow;
  lVar7 = (**(code **)(*(long *)&this->super_QPlatformWindow + 0x18))(pQVar1);
  local_80 = CONCAT44(**(undefined4 **)(*(long *)(lVar7 + 0x20) + 8),(undefined4)local_80);
  uStack_78 = (uint5)this->m_window;
  pxVar2 = (((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_xcbConnection;
  lVar7 = (**(code **)(*(long *)&this->super_QPlatformWindow + 0x18))(pQVar1);
  xcb_send_event(pxVar2,0,**(undefined4 **)(*(long *)(lVar7 + 0x20) + 8),0x180000,&local_80);
  xcb_flush((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).m_xcbConnection);
  this_00 = (this->super_QXcbObject).m_connection;
  if (this_00->m_mouseGrabber == this) {
    QXcbConnection::setMouseGrabber((QXcbConnection *)this_00,(QXcbWindow *)0x0);
  }
  pQVar3 = ((this->super_QXcbObject).m_connection)->m_mousePressWindow;
  if (pQVar3 != (QXcbWindow *)0x0) {
    pQVar8 = &pQVar3->super_QPlatformWindow;
    do {
      if (pQVar8 == pQVar1) {
        QXcbConnection::setMousePressWindow
                  ((QXcbConnection *)(this->super_QXcbObject).m_connection,(QXcbWindow *)0x0);
        break;
      }
      pQVar8 = (QPlatformWindow *)QPlatformWindow::parent();
    } while (pQVar8 != (QPlatformWindow *)0x0);
  }
  this->m_mapped = false;
  QPlatformWindow::window();
  cVar5 = QWindow::isModal();
  if (cVar5 != '\0') {
    local_88 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    plVar9 = (long *)(**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    plVar9 = (long *)(**(code **)(*plVar9 + 0xb0))(plVar9);
    local_88 = (QPoint)(**(code **)(*plVar9 + 0x80))(plVar9);
    local_90 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    pQVar10 = (QPoint *)(**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    QPlatformScreen::screenForPosition(pQVar10);
    pQVar11 = (QScreen *)QPlatformScreen::screen();
    local_90 = QHighDpi::fromNativePixels<QPoint,QScreen>(&local_88,pQVar11);
    local_a0 = &DAT_aaaaaaaaaaaaaaaa;
    local_b0 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_a8 = &DAT_aaaaaaaaaaaaaaaa;
    plVar9 = (long *)(**(code **)(*(long *)pQVar1 + 0x18))(pQVar1);
    (**(code **)(*plVar9 + 0x88))(&local_b0,plVar9);
    puVar4 = puStack_a8;
    if (local_a0 == (undefined1 *)0x0) {
      local_e0 = (QPoint *)0x0;
    }
    else {
      lVar7 = (long)local_a0 * 8;
      lVar13 = 0;
      local_e0 = (QPoint *)0x0;
      do {
        plVar9 = *(long **)(puVar4 + lVar13);
        QVar18 = (QPointF)(**(code **)(*plVar9 + 0x20))(plVar9);
        local_c0 = QVar18;
        bVar6 = QRect::contains((QPoint *)&local_c0,SUB81(&local_90,0));
        if (bVar6 != 0) {
          local_c0.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          pQVar11 = (QScreen *)QPlatformScreen::screen();
          local_c0.xp = (qreal)QHighDpi::toNativePixels<QPoint,QScreen>(&local_90,pQVar11);
          local_e0 = (QPoint *)(**(code **)(*plVar9 + 0x80))(plVar9,&local_c0);
        }
        bVar14 = lVar7 + -8 == lVar13;
        lVar13 = lVar13 + 8;
      } while ((bVar6 | bVar14) != 1);
    }
    if (local_e0 != (QPoint *)0x0) {
      pQVar10 = (QPoint *)QPlatformWindow::window();
      if (local_e0 != pQVar10) {
        pQVar10 = (QPoint *)childWindowAt((QWindow *)local_e0,&local_90);
        if (pQVar10 != (QPoint *)0x0) {
          local_e0 = pQVar10;
        }
        uVar12 = QWindow::mapFromGlobal(local_e0);
        dVar15 = (double)QHighDpiScaling::scaleAndOrigin((QWindow *)local_e0,(Point)ZEXT812(0));
        dVar16 = dVar15 * (double)(int)uVar12;
        dVar15 = dVar15 * (double)(int)((ulong)uVar12 >> 0x20);
        auVar17._0_8_ = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
        auVar17._8_8_ = (double)((ulong)dVar15 & 0x8000000000000000 | 0x3fe0000000000000) + dVar15;
        auVar17 = minpd(_DAT_00192d30,auVar17);
        auVar17 = maxpd(auVar17,_DAT_00192d40);
        local_c0.xp = (qreal)(int)auVar17._0_8_;
        local_c0.yp = (qreal)(int)auVar17._8_8_;
        local_d0.xp = (qreal)local_88.xp.m_i.m_i;
        local_d0.yp = (qreal)local_88.yp.m_i.m_i;
        QWindowSystemInterface::handleEnterEvent<QWindowSystemInterface::DefaultDelivery>
                  ((QWindow *)local_e0,&local_c0,&local_d0);
      }
    }
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_60) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QXcbWindow::hide()
{
    xcb_unmap_window(xcb_connection(), m_window);

    // send synthetic UnmapNotify event according to icccm 4.1.4
    q_padded_xcb_event<xcb_unmap_notify_event_t> event = {};
    event.response_type = XCB_UNMAP_NOTIFY;
    event.event = xcbScreen()->root();
    event.window = m_window;
    event.from_configure = false;
    xcb_send_event(xcb_connection(), false, xcbScreen()->root(),
                   XCB_EVENT_MASK_SUBSTRUCTURE_NOTIFY | XCB_EVENT_MASK_SUBSTRUCTURE_REDIRECT, (const char *)&event);

    xcb_flush(xcb_connection());

    if (connection()->mouseGrabber() == this)
        connection()->setMouseGrabber(nullptr);
    if (QPlatformWindow *w = connection()->mousePressWindow()) {
        // Unset mousePressWindow when it (or one of its parents) is unmapped
        while (w) {
            if (w == this) {
                connection()->setMousePressWindow(nullptr);
                break;
            }
            w = w->parent();
        }
    }

    m_mapped = false;

    // Hiding a modal window doesn't send an enter event to its transient parent when the
    // mouse is already over the parent window, so the enter event must be emulated.
    if (window()->isModal()) {
        // Get the cursor position at modal window screen
        const QPoint nativePos = xcbScreen()->cursor()->pos();
        const QPoint cursorPos = QHighDpi::fromNativePixels(nativePos, xcbScreen()->screenForPosition(nativePos)->screen());

        // Find the top level window at cursor position.
        // Don't use QGuiApplication::topLevelAt(): search only the virtual siblings of this window's screen
        QWindow *enterWindow = nullptr;
        const auto screens = xcbScreen()->virtualSiblings();
        for (QPlatformScreen *screen : screens) {
            if (screen->geometry().contains(cursorPos)) {
                const QPoint devicePosition = QHighDpi::toNativePixels(cursorPos, screen->screen());
                enterWindow = screen->topLevelAt(devicePosition);
                break;
            }
        }

        if (enterWindow && enterWindow != window()) {
            // Find the child window at cursor position, otherwise use the top level window
            if (QWindow *childWindow = childWindowAt(enterWindow, cursorPos))
                enterWindow = childWindow;
            const QPoint localPos = enterWindow->mapFromGlobal(cursorPos);
            QWindowSystemInterface::handleEnterEvent(enterWindow,
                                                     localPos * QHighDpiScaling::factor(enterWindow),
                                                     nativePos);
        }
    }
}